

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

action __thiscall Search::predictor::predict(predictor *this)

{
  char *pcVar1;
  action aVar2;
  ulong in_RAX;
  action *condition_on_names;
  long lVar3;
  ulong uVar4;
  float *allowed_actions;
  ulong allowed_actions_cnt;
  float *allowed_actions_cost;
  uint *oracle_actions;
  ptag *condition_on;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  undefined8 uStack_28;
  
  oracle_actions = (this->oracle_actions)._begin;
  condition_on_names = (action *)0x0;
  if ((this->oracle_actions)._end == oracle_actions) {
    oracle_actions = condition_on_names;
  }
  condition_on = (ptag *)0x0;
  uStack_28 = in_RAX;
  if ((this->condition_on_names)._end != (this->condition_on_names)._begin) {
    condition_on = (this->condition_on_tags)._begin;
    uStack_28 = in_RAX & 0xffffffffffffff;
    v_array<char>::push_back(&this->condition_on_names,(char *)((long)&uStack_28 + 7));
    condition_on_names = (action *)(this->condition_on_names)._begin;
    in_XMM0_Da = extraout_XMM0_Da;
  }
  if (this->is_ldf == true) {
    aVar2 = search::predictLDF(this->sch,this->ec,this->ec_cnt,this->my_tag,oracle_actions,
                               (long)(this->oracle_actions)._end -
                               (long)(this->oracle_actions)._begin >> 2,condition_on,
                               (char *)condition_on_names,this->learner_id,in_XMM0_Da);
  }
  else {
    allowed_actions = (float *)(this->allowed_actions)._begin;
    allowed_actions_cost = (this->allowed_actions_cost)._begin;
    lVar3 = (long)(this->allowed_actions)._end - (long)allowed_actions;
    if (lVar3 == 0) {
      allowed_actions = (float *)0x0;
    }
    uVar4 = lVar3 >> 2;
    lVar3 = (long)(this->allowed_actions_cost)._end - (long)allowed_actions_cost;
    if (lVar3 == 0) {
      allowed_actions_cost = (float *)0x0;
    }
    allowed_actions_cnt = lVar3 >> 2;
    if (allowed_actions_cnt < uVar4) {
      allowed_actions_cnt = uVar4;
    }
    aVar2 = search::predict(this->sch,this->ec,this->my_tag,oracle_actions,
                            (long)(this->oracle_actions)._end - (long)(this->oracle_actions)._begin
                            >> 2,condition_on,(char *)condition_on_names,(action *)allowed_actions,
                            allowed_actions_cnt,allowed_actions_cost,this->learner_id,in_XMM0_Da);
  }
  pcVar1 = (this->condition_on_names)._end;
  if (pcVar1 != (this->condition_on_names)._begin) {
    (this->condition_on_names)._end = pcVar1 + -1;
  }
  return aVar2;
}

Assistant:

action predictor::predict()
{
  const action* orA = oracle_actions.size() == 0 ? nullptr : oracle_actions.begin();
  const ptag* cOn = condition_on_names.size() == 0 ? nullptr : condition_on_tags.begin();
  const char* cNa = nullptr;
  if (condition_on_names.size() > 0)
  {
    condition_on_names.push_back((char)0);  // null terminate
    cNa = condition_on_names.begin();
  }
  const action* alA = (allowed_actions.size() == 0) ? nullptr : allowed_actions.begin();
  const float* alAcosts = (allowed_actions_cost.size() == 0) ? nullptr : allowed_actions_cost.begin();
  size_t numAlA = max(allowed_actions.size(), allowed_actions_cost.size());
  action p = is_ldf
      ? sch.predictLDF(ec, ec_cnt, my_tag, orA, oracle_actions.size(), cOn, cNa, learner_id, weight)
      : sch.predict(*ec, my_tag, orA, oracle_actions.size(), cOn, cNa, alA, numAlA, alAcosts, learner_id, weight);

  if (condition_on_names.size() > 0)
    condition_on_names.pop();  // un-null-terminate
  return p;
}